

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

Offset<reflection::Type> __thiscall
flatbuffers::Type::Serialize(Type *this,FlatBufferBuilder *builder)

{
  uint16_t fixed_length;
  BaseType t;
  BaseType element;
  uint32_t element_size;
  Offset<reflection::Type> OVar1;
  StructDef *pSVar3;
  int index;
  size_t sVar2;
  
  sVar2 = SizeOf(this->element);
  element_size = (uint32_t)sVar2;
  t = this->base_type;
  element = this->element;
  pSVar3 = this->struct_def;
  if (element == BASE_TYPE_STRUCT && t == BASE_TYPE_VECTOR) {
    if (pSVar3->bytesize != 0) {
      sVar2 = pSVar3->bytesize;
    }
    element_size = (uint32_t)sVar2;
  }
  else if ((pSVar3 == (StructDef *)0x0) &&
          (pSVar3 = (StructDef *)this->enum_def, pSVar3 == (StructDef *)0x0)) {
    index = -1;
    goto LAB_00126b13;
  }
  index = (pSVar3->super_Definition).index;
LAB_00126b13:
  fixed_length = this->fixed_length;
  sVar2 = SizeOf(t);
  OVar1 = reflection::CreateType(builder,t,element,index,fixed_length,(uint32_t)sVar2,element_size);
  return (Offset<reflection::Type>)OVar1.o;
}

Assistant:

Offset<reflection::Type> Type::Serialize(FlatBufferBuilder *builder) const {
  size_t element_size = SizeOf(element);
  if (base_type == BASE_TYPE_VECTOR && element == BASE_TYPE_STRUCT &&
      struct_def->bytesize != 0) {
    // struct_def->bytesize==0 means struct is table
    element_size = struct_def->bytesize;
  }
  return reflection::CreateType(
      *builder, static_cast<reflection::BaseType>(base_type),
      static_cast<reflection::BaseType>(element),
      struct_def ? struct_def->index : (enum_def ? enum_def->index : -1),
      fixed_length, static_cast<uint32_t>(SizeOf(base_type)),
      static_cast<uint32_t>(element_size));
}